

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence_helpers.cpp
# Opt level: O3

void __thiscall
spvtools::opt::LoopDependenceAnalysis::MarkUnsusedDistanceEntriesAsIrrelevant
          (LoopDependenceAnalysis *this,Instruction *source,Instruction *destination,
          DistanceVector *distance_vector)

{
  _Rb_tree_header *p_Var1;
  pointer ppLVar2;
  Loop *pLVar3;
  Loop *pLVar4;
  _Link_type p_Var5;
  pointer ppSVar6;
  SENode *pSVar7;
  long lVar8;
  long lVar9;
  pointer ppIVar10;
  _Link_type p_Var11;
  _Link_type p_Var12;
  _Link_type p_Var13;
  pointer ppSVar14;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  recurrent_nodes;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  destination_subscripts;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  source_subscripts;
  Loop *local_b8;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  local_b0;
  DistanceVector *local_98;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_90;
  _Rb_tree<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::_Identity<const_spvtools::opt::Loop_*>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
  local_78;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_48;
  
  local_98 = distance_vector;
  GetSubscripts(&local_48,this,source);
  GetSubscripts(&local_90,this,destination);
  local_78._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_78._M_impl.super__Rb_tree_header._M_header;
  local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_78._M_impl._0_8_ = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_right =
       local_78._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_48.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppIVar10 = local_48.
               super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    do {
      pSVar7 = ScalarEvolutionAnalysis::AnalyzeInstruction(&this->scalar_evolution_,*ppIVar10);
      pSVar7 = ScalarEvolutionAnalysis::SimplifyExpression(&this->scalar_evolution_,pSVar7);
      SENode::CollectRecurrentNodes(&local_b0,pSVar7);
      ppSVar6 = local_b0.
                super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppSVar14 = local_b0.
                      super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppSVar14 != ppSVar6;
          ppSVar14 = ppSVar14 + 1) {
        local_b8 = (*ppSVar14)->loop_;
        std::
        _Rb_tree<spvtools::opt::Loop_const*,spvtools::opt::Loop_const*,std::_Identity<spvtools::opt::Loop_const*>,std::less<spvtools::opt::Loop_const*>,std::allocator<spvtools::opt::Loop_const*>>
        ::_M_insert_unique<spvtools::opt::Loop_const*>
                  ((_Rb_tree<spvtools::opt::Loop_const*,spvtools::opt::Loop_const*,std::_Identity<spvtools::opt::Loop_const*>,std::less<spvtools::opt::Loop_const*>,std::allocator<spvtools::opt::Loop_const*>>
                    *)&local_78,&local_b8);
      }
      if (local_b0.
          super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b0.
                        super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_b0.
                              super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b0.
                              super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      ppIVar10 = ppIVar10 + 1;
    } while (ppIVar10 !=
             local_48.
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_90.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_90.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppIVar10 = local_90.
               super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    do {
      pSVar7 = ScalarEvolutionAnalysis::AnalyzeInstruction(&this->scalar_evolution_,*ppIVar10);
      pSVar7 = ScalarEvolutionAnalysis::SimplifyExpression(&this->scalar_evolution_,pSVar7);
      SENode::CollectRecurrentNodes(&local_b0,pSVar7);
      ppSVar6 = local_b0.
                super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppSVar14 = local_b0.
                      super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppSVar14 != ppSVar6;
          ppSVar14 = ppSVar14 + 1) {
        local_b8 = (*ppSVar14)->loop_;
        std::
        _Rb_tree<spvtools::opt::Loop_const*,spvtools::opt::Loop_const*,std::_Identity<spvtools::opt::Loop_const*>,std::less<spvtools::opt::Loop_const*>,std::allocator<spvtools::opt::Loop_const*>>
        ::_M_insert_unique<spvtools::opt::Loop_const*>
                  ((_Rb_tree<spvtools::opt::Loop_const*,spvtools::opt::Loop_const*,std::_Identity<spvtools::opt::Loop_const*>,std::less<spvtools::opt::Loop_const*>,std::allocator<spvtools::opt::Loop_const*>>
                    *)&local_78,&local_b8);
      }
      if (local_b0.
          super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b0.
                        super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_b0.
                              super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b0.
                              super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      ppIVar10 = ppIVar10 + 1;
    } while (ppIVar10 !=
             local_90.
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  ppLVar2 = (this->loops_).
            super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar8 = (long)(this->loops_).
                super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar2;
  p_Var1 = &local_78._M_impl.super__Rb_tree_header;
  if (lVar8 != 0) {
    lVar8 = lVar8 >> 3;
    lVar9 = 0;
    do {
      if ((_Link_type)local_78._M_impl.super__Rb_tree_header._M_header._M_parent == (_Link_type)0x0)
      {
LAB_0060f3c9:
        (local_98->entries).
        super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar9].dependence_information = IRRELEVANT;
      }
      else {
        pLVar3 = ppLVar2[lVar9];
        p_Var5 = (_Link_type)local_78._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var13 = (_Link_type)p_Var1;
        do {
          p_Var12 = p_Var13;
          p_Var11 = p_Var5;
          pLVar4 = *(Loop **)(p_Var11->_M_storage)._M_storage;
          p_Var13 = p_Var11;
          if (pLVar4 < pLVar3) {
            p_Var13 = p_Var12;
          }
          p_Var5 = *(_Link_type *)(&p_Var11->_M_storage)[(ulong)(pLVar4 < pLVar3) - 2]._M_storage;
        } while (p_Var5 != (_Link_type)0x0);
        if ((_Rb_tree_header *)p_Var13 == p_Var1) goto LAB_0060f3c9;
        if (pLVar4 < pLVar3) {
          p_Var11 = p_Var12;
        }
        if (pLVar3 < *(Loop **)(p_Var11->_M_storage)._M_storage) goto LAB_0060f3c9;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != lVar8 + (ulong)(lVar8 == 0));
  }
  std::
  _Rb_tree<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::_Identity<const_spvtools::opt::Loop_*>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
  ::_M_erase(&local_78,(_Link_type)local_78._M_impl.super__Rb_tree_header._M_header._M_parent);
  if (local_90.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.
                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void LoopDependenceAnalysis::MarkUnsusedDistanceEntriesAsIrrelevant(
    const Instruction* source, const Instruction* destination,
    DistanceVector* distance_vector) {
  std::vector<Instruction*> source_subscripts = GetSubscripts(source);
  std::vector<Instruction*> destination_subscripts = GetSubscripts(destination);

  std::set<const Loop*> used_loops{};

  for (Instruction* source_inst : source_subscripts) {
    SENode* source_node = scalar_evolution_.SimplifyExpression(
        scalar_evolution_.AnalyzeInstruction(source_inst));
    std::vector<SERecurrentNode*> recurrent_nodes =
        source_node->CollectRecurrentNodes();
    for (SERecurrentNode* recurrent_node : recurrent_nodes) {
      used_loops.insert(recurrent_node->GetLoop());
    }
  }

  for (Instruction* destination_inst : destination_subscripts) {
    SENode* destination_node = scalar_evolution_.SimplifyExpression(
        scalar_evolution_.AnalyzeInstruction(destination_inst));
    std::vector<SERecurrentNode*> recurrent_nodes =
        destination_node->CollectRecurrentNodes();
    for (SERecurrentNode* recurrent_node : recurrent_nodes) {
      used_loops.insert(recurrent_node->GetLoop());
    }
  }

  for (size_t i = 0; i < loops_.size(); ++i) {
    if (used_loops.find(loops_[i]) == used_loops.end()) {
      distance_vector->GetEntries()[i].dependence_information =
          DistanceEntry::DependenceInformation::IRRELEVANT;
    }
  }
}